

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall
ddd::DaTrie<true,_false,_false>::enumerate
          (DaTrie<true,_false,_false> *this,uint32_t node_pos,string *prefix,
          vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *kvs)

{
  bool bVar1;
  uint32_t uVar2;
  ulong uVar3;
  size_type sVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  char *pcVar7;
  string *in_RCX;
  string *in_RDX;
  uint in_ESI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  uint32_t label;
  uint32_t child_pos;
  uint32_t base;
  uint32_t tail_pos;
  KvPair kv;
  uint32_t in_stack_ffffffffffffff54;
  DaTrie<true,_false,_false> *in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  string *this_00;
  string local_88 [36];
  uint local_64;
  uint32_t local_60;
  uint32_t local_5c;
  uint local_58;
  string local_48 [32];
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_fffffffffffffff0;
  
  uVar3 = (ulong)in_ESI;
  sVar4 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::size
                    ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)in_RDI);
  if (sVar4 <= uVar3) {
    __assert_fail("node_pos < bc_.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x8a,
                  "void ddd::DaTrie<true, false, false>::enumerate(uint32_t, const std::string &, std::vector<KvPair> &) const [WithBLM = true, WithNLM = false, Prefix = false]"
                 );
  }
  pvVar5 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                     ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)in_RDI,(ulong)in_ESI);
  bVar1 = Bc::is_fixed(pvVar5);
  if (!bVar1) {
    __assert_fail("bc_[node_pos].is_fixed()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x8b,
                  "void ddd::DaTrie<true, false, false>::enumerate(uint32_t, const std::string &, std::vector<KvPair> &) const [WithBLM = true, WithNLM = false, Prefix = false]"
                 );
  }
  pvVar5 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                     ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)in_RDI,(ulong)in_ESI);
  bVar1 = Bc::is_leaf(pvVar5);
  if (bVar1) {
    this_00 = local_48;
    KvPair::KvPair((KvPair *)0x171947);
    std::__cxx11::string::operator=(this_00,in_RDX);
    bVar1 = is_terminal_(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
    if (bVar1) {
      pvVar5 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                         ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)in_RDI,(ulong)in_ESI);
      Bc::value(pvVar5);
    }
    else {
      pvVar5 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                         ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)in_RDI,(ulong)in_ESI);
      local_58 = Bc::value(pvVar5);
      while( true ) {
        pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x18),(ulong)local_58);
        if (*pvVar6 == '\0') break;
        uVar3 = (ulong)local_58;
        local_58 = local_58 + 1;
        pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x18),uVar3);
        std::__cxx11::string::operator+=(local_48,*pvVar6);
      }
      uVar3 = (ulong)local_58;
      local_58 = local_58 + 1;
      pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x18),uVar3);
      std::__cxx11::string::operator+=(local_48,*pvVar6);
      pcVar7 = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)0x171a57);
      utils::extract_value(pcVar7 + local_58);
    }
    std::vector<ddd::KvPair,_std::allocator<ddd::KvPair>_>::push_back
              ((vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *)this_00,
               (value_type *)in_stack_ffffffffffffff58);
    KvPair::~KvPair((KvPair *)0x171a8b);
  }
  else {
    pvVar5 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                       ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)in_RDI,(ulong)in_ESI);
    local_60 = Bc::base(pvVar5);
    local_5c = local_60;
    pvVar5 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                       ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)in_RDI,(ulong)local_60);
    uVar2 = Bc::check(pvVar5);
    if (uVar2 == in_ESI) {
      enumerate((DaTrie<true,_false,_false> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                (uint32_t)((ulong)in_RDX >> 0x20),in_RCX,
                (vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *)
                CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    }
    for (local_64 = 1; local_64 < 0x100; local_64 = local_64 + 1) {
      local_60 = local_5c ^ local_64;
      pvVar5 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                         ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)in_RDI,(ulong)local_60);
      uVar2 = Bc::check(pvVar5);
      if (uVar2 == in_ESI) {
        std::operator+(in_RDI,(char)((ulong)in_stack_ffffffffffffff60 >> 0x38));
        enumerate((DaTrie<true,_false,_false> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                  (uint32_t)((ulong)in_RDX >> 0x20),in_RCX,
                  (vector<ddd::KvPair,_std::allocator<ddd::KvPair>_> *)
                  CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
        std::__cxx11::string::~string(local_88);
      }
    }
  }
  return;
}

Assistant:

void enumerate(uint32_t node_pos, const std::string& prefix, std::vector<KvPair>& kvs) const {
    assert(node_pos < bc_.size());
    assert(bc_[node_pos].is_fixed());
    assert(!Prefix);

    if (bc_[node_pos].is_leaf()) {
      KvPair kv;
      kv.key = prefix;
      if (is_terminal_(node_pos)) {
        kv.value = bc_[node_pos].value();
      } else {
        auto tail_pos = bc_[node_pos].value();
        while (tail_[tail_pos] != '\0') {
          kv.key += tail_[tail_pos++];
        }
        kv.key += tail_[tail_pos++];
        kv.value = utils::extract_value(tail_.data() + tail_pos);
      }
      kvs.push_back(kv);
      return;
    }

    auto base = bc_[node_pos].base();
    auto child_pos = base ^static_cast<uint8_t>('\0');
    if (bc_[child_pos].check() == node_pos) {
      enumerate(child_pos, prefix, kvs);
    }

    for (uint32_t label = 1; label < 256; ++label) {
      child_pos = base ^ label;
      if (bc_[child_pos].check() == node_pos) {
        enumerate(child_pos, prefix + static_cast<char>(label), kvs);
      }
    }
  }